

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDelete(BtCursor *pCur)

{
  u16 uVar1;
  int iVar2;
  uint uVar3;
  u8 *pCell_00;
  long *in_RDI;
  uchar *pTmp;
  Pgno n;
  int nCell;
  MemPage *pLeaf;
  int notUsed;
  u16 szCell;
  int iCellDepth;
  int iCellIdx;
  uchar *pCell;
  MemPage *pPage;
  int rc;
  BtShared *pBt;
  Btree *p;
  BtCursor *in_stack_ffffffffffffff98;
  BtCursor *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  BtShared *in_stack_ffffffffffffffb0;
  MemPage *pPage_00;
  int in_stack_ffffffffffffffb8;
  Pgno in_stack_ffffffffffffffbc;
  int sz;
  u8 *pCell_01;
  BtCursor *pCur_00;
  Btree *pBtree;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  pBtree = (Btree *)*in_RDI;
  pCur_00 = (BtCursor *)pBtree->pBt;
  if ((*(ushort *)((long)in_RDI + (long)(short)in_RDI[0xe] * 2 + 0x72) <
       *(ushort *)(in_RDI[(long)(short)in_RDI[0xe] + 0x14] + 0x12)) &&
     (*(char *)((long)in_RDI + 0x6d) == '\x01')) {
    iVar2 = (int)(short)in_RDI[0xe];
    uVar3 = (uint)*(ushort *)((long)in_RDI + (long)iVar2 * 2 + 0x72);
    pCell_01 = (u8 *)in_RDI[(long)iVar2 + 0x14];
    if (pCell_01[5] == '\0') {
      in_stack_ffffffffffffffb8 = 0;
      iVar4 = sqlite3BtreePrevious(in_stack_ffffffffffffff98,(int *)0x14b06c);
      if (iVar4 != 0) {
        return iVar4;
      }
    }
    iVar4 = saveAllCursors(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa0);
    if (iVar4 == 0) {
      if (in_RDI[4] == 0) {
        invalidateIncrblobCursors(pBtree,in_RDI[6],0);
      }
      iVar4 = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff98);
      if (iVar4 == 0) {
        iVar4 = clearCell((MemPage *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (uchar *)in_RDI,(u16 *)pBtree);
        dropCell((MemPage *)CONCAT44(uVar3,iVar2),in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0);
        if (iVar4 == 0) {
          if (pCell_01[5] == '\0') {
            pPage_00 = (MemPage *)in_RDI[(long)(short)in_RDI[0xe] + 0x14];
            in_stack_ffffffffffffffa8 = *(undefined4 *)(in_RDI[(long)(iVar2 + 1) + 0x14] + 0x70);
            pCell_00 = pPage_00->aData +
                       (int)(uint)(pPage_00->maskPage &
                                  CONCAT11(pPage_00->aCellIdx[(int)((pPage_00->nCell - 1) * 2)],
                                           pPage_00->aCellIdx
                                           [(long)(int)((pPage_00->nCell - 1) * 2) + 1]));
            uVar1 = cellSizePtr(pPage_00,pCell_00);
            sz = (int)((ulong)pCell_00 >> 0x20);
            in_stack_ffffffffffffffac = (uint)uVar1;
            iVar4 = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff98);
            insertCell((MemPage *)pCur_00,iVar4,pCell_01,sz,(u8 *)CONCAT44(uVar3,iVar2),
                       in_stack_ffffffffffffffbc,(int *)in_RDI);
            dropCell((MemPage *)CONCAT44(uVar3,iVar2),in_stack_ffffffffffffffbc,
                     in_stack_ffffffffffffffb8,(int *)pPage_00);
            if (iVar4 != 0) {
              return iVar4;
            }
          }
          iVar4 = balance(pCur_00);
          if ((iVar4 == 0) && (iVar2 < (short)in_RDI[0xe])) {
            while (iVar2 < (short)in_RDI[0xe]) {
              *(short *)(in_RDI + 0xe) = (short)in_RDI[0xe] + -1;
              releasePage((MemPage *)0x14b2e8);
            }
            iVar4 = balance(pCur_00);
          }
          if (iVar4 == 0) {
            moveToRoot((BtCursor *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          }
        }
      }
    }
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  u16 szCell;                          /* Size of the cell being deleted */

  assert( cursorHoldsMutex(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );

  if( NEVER(pCur->aiIdx[pCur->iPage]>=pCur->apPage[pCur->iPage]->nCell) 
   || NEVER(pCur->eState!=CURSOR_VALID)
  ){
    return SQLITE_ERROR;  /* Something has gone awry. */
  }

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->aiIdx[iCellDepth];
  pPage = pCur->apPage[iCellDepth];
  pCell = findCell(pPage, iCellIdx);

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    int notUsed = 0;
    rc = sqlite3BtreePrevious(pCur, &notUsed);
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications. Make the page containing the entry to be 
  ** deleted writable. Then free any overflow pages associated with the 
  ** entry and finally remove the cell itself from within the page.  
  */
  rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
  if( rc ) return rc;

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->info.nKey, 0);
  }

  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &szCell);
  dropCell(pPage, iCellIdx, szCell, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->apPage[pCur->iPage];
    int nCell;
    Pgno n = pCur->apPage[iCellDepth+1]->pgno;
    unsigned char *pTmp;

    pCell = findCell(pLeaf, pLeaf->nCell-1);
    nCell = cellSizePtr(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    moveToRoot(pCur);
  }
  return rc;
}